

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O3

bool __thiscall QWindowsStyle::eventFilter(QWindowsStyle *this,QObject *o,QEvent *e)

{
  short sVar1;
  undefined1 uVar2;
  int iVar3;
  QWidget *pQVar4;
  QStyle *pQVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QList<QWidget_*> list;
  anon_class_8_1_54a39814_for__M_pred local_58;
  long lStack_50;
  long local_48;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(o + 8) + 0x30) & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar2 = QObject::eventFilter((QObject *)this,(QEvent *)o);
      return (bool)uVar2;
    }
  }
  else {
    lVar6 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
    sVar1 = *(short *)(e + 8);
    if (sVar1 == 0x13) {
      local_58.t = (QWindow **)&local_40;
      local_40 = (QWidget *)o;
      QtPrivate::
      sequential_erase_if<QList<QWidget_const*>,QtPrivate::sequential_erase<QList<QWidget_const*>,QWidget*>(QList<QWidget_const*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
                ((QList<const_QWidget_*> *)(lVar6 + 0xf0),&local_58);
      local_40 = QWidget::window((QWidget *)o);
      local_58.t = (QWindow **)&local_40;
      QtPrivate::
      sequential_erase_if<QList<QWidget_const*>,QtPrivate::sequential_erase<QList<QWidget_const*>,QWidget*>(QList<QWidget_const*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
                ((QList<const_QWidget_*> *)(lVar6 + 0xf0),&local_58);
    }
    else if (sVar1 == 7) {
      if (*(int *)(e + 0x40) == 0x1000023) {
        pQVar4 = QWidget::window((QWidget *)o);
        *(undefined1 *)(lVar6 + 0xe8) = 0;
        local_58.t = (QWindow **)0x0;
        lStack_50 = 0;
        local_48 = 0;
        qt_qFindChildren_helper(pQVar4,0,0,&QMenuBar::staticMetaObject,&local_58,1);
        lVar6 = lStack_50;
        if (local_48 != 0) {
          lVar8 = local_48 << 3;
          lVar7 = 0;
          do {
            QWidget::update(*(QWidget **)(lVar6 + lVar7));
            lVar7 = lVar7 + 8;
          } while (lVar8 != lVar7);
        }
        if ((QArrayData *)local_58.t != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.t = *(int *)local_58.t + -1;
          UNLOCK();
          if (*(int *)local_58.t == 0) {
            QArrayData::deallocate((QArrayData *)local_58.t,8,0x10);
          }
        }
      }
    }
    else if ((sVar1 == 6) && (*(int *)(e + 0x40) == 0x1000023)) {
      pQVar4 = QWidget::window((QWidget *)o);
      local_58.t = (QWindow **)0x0;
      lStack_50 = 0;
      local_48 = 0;
      qt_qFindChildren_helper(pQVar4,0,0,&QWidget::staticMetaObject,&local_58,1);
      local_40 = pQVar4;
      QtPrivate::QPodArrayOps<QWidget_const*>::emplace<QWidget_const*&>
                ((QPodArrayOps<QWidget_const*> *)(lVar6 + 0xf0),*(qsizetype *)(lVar6 + 0x100),
                 &local_40);
      QList<const_QWidget_*>::end((QList<const_QWidget_*> *)(lVar6 + 0xf0));
      lVar7 = lStack_50;
      *(undefined1 *)(lVar6 + 0xe8) = 1;
      if (local_48 != 0) {
        lVar6 = local_48 << 3;
        lVar8 = 0;
        do {
          pQVar4 = *(QWidget **)(lVar7 + lVar8);
          if ((((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
             ((pQVar4->data->widget_attributes & 0x8000) != 0)) {
            pQVar5 = QWidget::style(pQVar4);
            iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x29,0,pQVar4,0);
            if (iVar3 == 0) {
              QWidget::update(pQVar4);
            }
          }
          lVar8 = lVar8 + 8;
        } while (lVar6 != lVar8);
      }
      if ((QArrayData *)local_58.t != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.t = *(int *)local_58.t + -1;
        UNLOCK();
        if (*(int *)local_58.t == 0) {
          QArrayData::deallocate((QArrayData *)local_58.t,8,0x10);
        }
      }
    }
    uVar2 = QObject::eventFilter((QObject *)this,(QEvent *)o);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)uVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowsStyle::eventFilter(QObject *o, QEvent *e)
{
    // Records Alt- and Focus events
    if (!o->isWidgetType())
        return QObject::eventFilter(o, e);

    QWidget *widget = qobject_cast<QWidget*>(o);
    Q_D(QWindowsStyle);
    switch(e->type()) {
    case QEvent::KeyPress:
        if (static_cast<QKeyEvent *>(e)->key() == Qt::Key_Alt) {
            widget = widget->window();

            // Alt has been pressed - find all widgets that care
            const QList<QWidget *> children = widget->findChildren<QWidget *>();
            auto ignorable = [](QWidget *w) {
                return w->isWindow() || !w->isVisible()
                        || w->style()->styleHint(SH_UnderlineShortcut, nullptr, w);
            };
            // Update states before repainting
            d->seenAlt.append(widget);
            d->alt_down = true;

            // Repaint all relevant widgets
            for (QWidget *w : children) {
                if (!ignorable(w))
                    w->update();
            }
        }
        break;
    case QEvent::KeyRelease:
        if (static_cast<QKeyEvent*>(e)->key() == Qt::Key_Alt) {
            widget = widget->window();

            // Update state and repaint the menu bars.
            d->alt_down = false;
#if QT_CONFIG(menubar)
            const QList<QMenuBar *> menuBars = widget->findChildren<QMenuBar *>();
            for (QWidget *w : menuBars)
                w->update();
#endif
        }
        break;
    case QEvent::Close:
        // Reset widget when closing
        d->seenAlt.removeAll(widget);
        d->seenAlt.removeAll(widget->window());
        break;
    default:
        break;
    }
    return QCommonStyle::eventFilter(o, e);
}